

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

void j2k_dump_image_header(opj_image_t *img_header,opj_bool dev_dump_flag,FILE *out_stream)

{
  undefined1 uVar1;
  ulong in_RAX;
  long lVar2;
  ulong uVar3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (dev_dump_flag == 0) {
    fwrite("Image info {\n",0xd,1,(FILE *)out_stream);
    uStack_38 = uStack_38 & 0xffffffffffffff;
    uVar1 = 9;
  }
  else {
    fwrite("[DEV] Dump an image_header struct {\n",0x24,1,_stdout);
    uVar1 = 0;
  }
  lVar2 = (long)&uStack_38 + 6;
  uStack_38._0_7_ = CONCAT16(uVar1,(undefined6)uStack_38);
  fprintf((FILE *)out_stream,"%s x0=%d, y0=%d\n",lVar2,(ulong)img_header->x0,(ulong)img_header->y0);
  fprintf((FILE *)out_stream,"%s x1=%d, y1=%d\n",lVar2,(ulong)img_header->x1,(ulong)img_header->y1);
  fprintf((FILE *)out_stream,"%s numcomps=%d\n",lVar2,(ulong)img_header->numcomps);
  if ((img_header->comps != (opj_image_comp_t *)0x0) && (img_header->numcomps != 0)) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      fprintf((FILE *)out_stream,"%s\t component %d {\n",(long)&uStack_38 + 6,uVar3 & 0xffffffff);
      j2k_dump_image_comp_header
                ((opj_image_comp_t *)((long)&img_header->comps->dx + lVar2),dev_dump_flag,out_stream
                );
      fprintf((FILE *)out_stream,"%s}\n",(long)&uStack_38 + 6);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x38;
    } while (uVar3 < img_header->numcomps);
  }
  fwrite("}\n",2,1,(FILE *)out_stream);
  return;
}

Assistant:

void j2k_dump_image_header(opj_image_t* img_header, opj_bool dev_dump_flag, FILE* out_stream)
{
	char tab[2];

	if (dev_dump_flag){
		fprintf(stdout, "[DEV] Dump an image_header struct {\n");
		tab[0] = '\0';
	}
	else {
		fprintf(out_stream, "Image info {\n");
		tab[0] = '\t';tab[1] = '\0';
	}

	fprintf(out_stream, "%s x0=%d, y0=%d\n", tab, img_header->x0, img_header->y0);
	fprintf(out_stream,	"%s x1=%d, y1=%d\n", tab, img_header->x1, img_header->y1);
	fprintf(out_stream, "%s numcomps=%d\n", tab, img_header->numcomps);

	if (img_header->comps){
		int compno;
		for (compno = 0; compno < img_header->numcomps; compno++) {
			fprintf(out_stream, "%s\t component %d {\n", tab, compno);
			j2k_dump_image_comp_header(&(img_header->comps[compno]), dev_dump_flag, out_stream);
			fprintf(out_stream,"%s}\n",tab);
		}
	}

	fprintf(out_stream, "}\n");
}